

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::
       tuple_caster<std::tuple,std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
       ::
       cast_impl<std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,0ul,1ul>
                 (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  __tuple_element_t<0UL,_tuple<vector<double,_allocator<double>_>,_vector<vector<double,_allocator<double>_>,_allocator<vector<double,_allocator<double>_>_>_>_>_>
  *src_00;
  handle hVar4;
  __tuple_element_t<1UL,_tuple<vector<double,_allocator<double>_>,_vector<vector<double,_allocator<double>_>,_allocator<vector<double,_allocator<double>_>_>_>_>_>
  *src_01;
  iterator pvVar5;
  PyObject **ppPVar6;
  handle local_d8;
  iterator local_d0;
  value_type *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_2UL> *__range3_1;
  int counter;
  tuple result;
  value_type *entry;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range3;
  undefined1 local_40 [8];
  array<pybind11::object,_2UL> entries;
  return_value_policy policy_local;
  tuple<std::vector<double,_std::allocator<double>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  *src_local;
  handle parent_local;
  
  entries._M_elems[1].super_handle.m_ptr._7_1_ = policy;
  src_00 = std::
           get<0ul,std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                     (src);
  hVar4 = list_caster<std::vector<double,std::allocator<double>>,double>::
          cast<std::vector<double,std::allocator<double>>>
                    (src_00,entries._M_elems[1].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)local_40,hVar4);
  src_01 = std::
           get<1ul,std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                     (src);
  hVar4 = list_caster<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>>
          ::
          cast<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (src_01,entries._M_elems[1].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)&entries,hVar4);
  __end0 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)local_40);
  pvVar5 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)local_40);
  do {
    if (__end0 == pvVar5) {
      tuple::tuple((tuple *)&stack0xffffffffffffff58,2);
      __range3_1._4_4_ = 0;
      __begin0_1 = (iterator)local_40;
      __end0_1 = std::array<pybind11::object,_2UL>::begin
                           ((array<pybind11::object,_2UL> *)__begin0_1);
      entry_1 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)__begin0_1);
      for (; __end0_1 != entry_1; __end0_1 = __end0_1 + 1) {
        local_d0 = __end0_1;
        local_d8 = object::release(__end0_1);
        ppPVar6 = handle::ptr(&local_d8);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)&stack0xffffffffffffff58);
        iVar3 = PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar3 == 0) {
          __assert_fail("PyTuple_Check(result.ptr())",
                        "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/cast.h"
                        ,0x25b,
                        "static handle pybind11::detail::tuple_caster<std::tuple, std::vector<double>, std::vector<std::vector<double>>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <std::vector<double>, std::vector<std::vector<double>>>, T = std::tuple<std::vector<double>, std::vector<std::vector<double>>>, Is = <0UL, 1UL>]"
                       );
        }
        ppPVar6 = handle::ptr((handle *)&stack0xffffffffffffff58);
        (&(*ppPVar6)[1].ob_type)[__range3_1._4_4_] = pPVar1;
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
      }
      parent_local = object::release((object *)&stack0xffffffffffffff58);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      tuple::~tuple((tuple *)&stack0xffffffffffffff58);
LAB_00149447:
      std::array<pybind11::object,_2UL>::~array((array<pybind11::object,_2UL> *)local_40);
      return (handle)parent_local.m_ptr;
    }
    bVar2 = handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) {
      memset(&parent_local,0,8);
      handle::handle(&parent_local);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      goto LAB_00149447;
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }